

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind_def.cpp
# Opt level: O2

PyObject * PyInit_slopeOP(void)

{
  undefined1 auVar1 [8];
  int iVar2;
  char *pcVar3;
  function_record *pfVar4;
  class_<PeltResult<float,float>> *pcVar5;
  class_<OmegaOP> *pcVar6;
  class_<OmegaSN> *pcVar7;
  arg local_168;
  module m;
  undefined1 local_150 [8];
  handle local_148;
  char *local_140;
  object local_138 [5];
  arg_v local_110;
  cpp_function cf;
  arg local_90;
  arg local_80;
  _func_OmegaOP_ptr_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_double_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *local_70;
  int local_64;
  arg local_60;
  arg local_50;
  arg local_40;
  
  pcVar3 = (char *)Py_GetVersion();
  iVar2 = strncmp(pcVar3,"3.10",4);
  if ((iVar2 == 0) && (9 < (byte)(pcVar3[4] - 0x30U))) {
    pybind11::module::module(&m,"slopeOP",(char *)0x0);
    pybind11::class_<PeltResult<float,_float>_>::class_<>
              ((class_<PeltResult<float,_float>_> *)&local_168,
               (handle)m.super_object.super_handle.m_ptr,"PeltResult");
    pcVar3 = local_168.name;
    local_110.super_arg.name = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)local_150,(handle)local_168.name,"__init__",
                      (PyObject *)&_Py_NoneStruct);
    auVar1 = local_150;
    cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar4 = pybind11::cpp_function::make_function_record(&cf);
    pfVar4->impl = pybind11::cpp_function::
                   initialize<pybind11::detail::initimpl::factory<pybind11_init_slopeOP(pybind11::module&)::$_0,pybind11::detail::void_type(*)(),PeltResult<float,float>*(std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double),pybind11::detail::void_type()>::execute<pybind11::class_<PeltResult<float,float>>>(pybind11::class_<PeltResult<float,float>>&)&&::{lambda(pybind11::detail::function_call&)#1}(pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double)#1},void,pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<PeltResult<float,float>>&&,void(*)(pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar4->name = "__init__";
    (pfVar4->scope).m_ptr = (PyObject *)pcVar3;
    (pfVar4->sibling).m_ptr = (PyObject *)auVar1;
    pfVar4->field_0x59 = pfVar4->field_0x59 | 0x42;
    pybind11::cpp_function::initialize_generic
              (&cf,pfVar4,"({%}, {List[int]}, {List[float]}, {List[float]}, {float}) -> None",
               (type_info **)
               pybind11::cpp_function::
               initialize<pybind11::detail::initimpl::factory<pybind11_init_slopeOP(pybind11::module&)::$_0,pybind11::detail::void_type(*)(),PeltResult<float,float>*(std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double),pybind11::detail::void_type()>::execute<pybind11::class_<PeltResult<float,float>>>(pybind11::class_<PeltResult<float,float>>&)&&::{lambda(pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double)#1},void,pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::detail::is_new_style_constructor>(pybind11::class_<PeltResult<float,float>>&&,void(*)(pybind11::detail::value_and_holder&,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,double),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::detail::is_new_style_constructor_const&)
               ::types,5);
    pybind11::object::~object((object *)local_150);
    pybind11::object::~object((object *)&local_110);
    pybind11::cpp_function::name((cpp_function *)&local_110);
    pybind11::detail::object_api<pybind11::handle>::attr
              ((obj_attr_accessor *)local_150,(object_api<pybind11::handle> *)&local_168,
               (handle)local_110.super_arg.name);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_150,&cf);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_150);
    pybind11::object::~object((object *)&local_110);
    pybind11::object::~object((object *)&cf);
    pcVar5 = (class_<PeltResult<float,float>> *)
             pybind11::class_<PeltResult<float,float>>::
             def_readwrite<PeltResult<float,float>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                       ((class_<PeltResult<float,float>> *)&local_168,"cp",0);
    pcVar5 = (class_<PeltResult<float,float>> *)
             pybind11::class_<PeltResult<float,float>>::
             def_readwrite<PeltResult<float,float>,std::vector<float,std::allocator<float>>>
                       (pcVar5,"x",0x18);
    pcVar5 = (class_<PeltResult<float,float>> *)
             pybind11::class_<PeltResult<float,float>>::
             def_readwrite<PeltResult<float,float>,std::vector<float,std::allocator<float>>>
                       (pcVar5,"y",0x30);
    pybind11::class_<PeltResult<float,float>>::def_readwrite<PeltResult<float,float>,double>
              (pcVar5,"cost",0x48);
    pybind11::object::~object((object *)&local_168);
    pybind11::class_<OmegaOP>::class_<>
              ((class_<OmegaOP> *)&local_168,(handle)m.super_object.super_handle.m_ptr,"OmegaOP");
    pcVar3 = local_168.name;
    local_110.super_arg.name = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)local_150,(handle)local_168.name,"GetChangepoints",
                      (PyObject *)&_Py_NoneStruct);
    cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar4 = pybind11::cpp_function::make_function_record(&cf);
    pfVar4->impl = pybind11::cpp_function::
                   initialize<pybind11_init_slopeOP(pybind11::module&)::$_1,std::vector<int,std::allocator<int>>,OmegaOP_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(pybind11_init_slopeOP(pybind11::module&)::$_1&&,std::vector<int,std::allocator<int>>(*)(OmegaOP_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar4->name = "GetChangepoints";
    pfVar4->field_0x59 = pfVar4->field_0x59 | 0x40;
    (pfVar4->scope).m_ptr = (PyObject *)pcVar3;
    (pfVar4->sibling).m_ptr = (PyObject *)local_150;
    pfVar4->policy = copy;
    pybind11::cpp_function::initialize_generic
              (&cf,pfVar4,"({%}) -> List[int]",
               (type_info **)
               pybind11::cpp_function::
               initialize<pybind11_init_slopeOP(pybind11::module&)::$_1,std::vector<int,std::allocator<int>>,OmegaOP_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(pybind11_init_slopeOP(pybind11::module&)::$_1&&,std::vector<int,std::allocator<int>>(*)(OmegaOP_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
               ::types,1);
    pybind11::object::~object((object *)local_150);
    pybind11::object::~object((object *)&local_110);
    pybind11::cpp_function::name((cpp_function *)&local_110);
    pybind11::detail::object_api<pybind11::handle>::attr
              ((obj_attr_accessor *)local_150,(object_api<pybind11::handle> *)&local_168,
               (handle)local_110.super_arg.name);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_150,&cf);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_150);
    pybind11::object::~object((object *)&local_110);
    pybind11::object::~object((object *)&cf);
    local_150 = (undefined1  [8])OmegaOP::GetParameters;
    local_148.m_ptr = (PyObject *)0x0;
    pcVar6 = pybind11::class_<OmegaOP>::
             def<std::vector<double,std::allocator<double>>(OmegaOP::*)()const>
                       ((class_<OmegaOP> *)&local_168,"GetParameters",
                        (offset_in_OmegaOP_to_subr *)local_150);
    cf.super_function.super_object.super_handle.m_ptr = (function)OmegaOP::GetGlobalCost;
    pcVar6 = pybind11::class_<OmegaOP>::def<double(OmegaOP::*)()const>
                       (pcVar6,"GetGlobalCost",(offset_in_OmegaOP_to_subr *)&cf);
    local_110.super_arg.name = (char *)OmegaOP::GetPruning;
    local_110.super_arg._8_8_ = 0;
    pybind11::class_<OmegaOP>::def<double(OmegaOP::*)()const>
              (pcVar6,"GetPruning",(offset_in_OmegaOP_to_subr *)&local_110);
    pybind11::object::~object((object *)&local_168);
    pybind11::class_<OmegaSN>::class_<>
              ((class_<OmegaSN> *)&local_168,(handle)m.super_object.super_handle.m_ptr,"OmegaSN");
    local_110.super_arg.name = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    pybind11::getattr((pybind11 *)local_150,(handle)local_168.name,"GetChangepoints",
                      (PyObject *)&_Py_NoneStruct);
    auVar1 = local_150;
    cf.super_function.super_object.super_handle.m_ptr = (function)(object)0x0;
    pfVar4 = pybind11::cpp_function::make_function_record(&cf);
    pfVar4->impl = pybind11::cpp_function::
                   initialize<pybind11_init_slopeOP(pybind11::module&)::$_2,std::vector<int,std::allocator<int>>,OmegaSN_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(pybind11_init_slopeOP(pybind11::module&)::$_2&&,std::vector<int,std::allocator<int>>(*)(OmegaSN_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
                   ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
    pfVar4->name = "GetChangepoints";
    pfVar4->field_0x59 = pfVar4->field_0x59 | 0x40;
    (pfVar4->scope).m_ptr = (PyObject *)local_168.name;
    (pfVar4->sibling).m_ptr = (PyObject *)auVar1;
    pfVar4->policy = copy;
    pybind11::cpp_function::initialize_generic
              (&cf,pfVar4,"({%}) -> List[int]",
               (type_info **)
               pybind11::cpp_function::
               initialize<pybind11_init_slopeOP(pybind11::module&)::$_2,std::vector<int,std::allocator<int>>,OmegaSN_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>(pybind11_init_slopeOP(pybind11::module&)::$_2&&,std::vector<int,std::allocator<int>>(*)(OmegaSN_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
               ::types,1);
    pybind11::object::~object((object *)local_150);
    pybind11::object::~object((object *)&local_110);
    pybind11::cpp_function::name((cpp_function *)&local_110);
    pybind11::detail::object_api<pybind11::handle>::attr
              ((obj_attr_accessor *)local_150,(object_api<pybind11::handle> *)&local_168,
               (handle)local_110.super_arg.name);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_150,&cf);
    pybind11::detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_150);
    pybind11::object::~object((object *)&local_110);
    pybind11::object::~object((object *)&cf);
    local_150 = (undefined1  [8])OmegaSN::GetParameters;
    local_148.m_ptr = (PyObject *)0x0;
    pcVar7 = pybind11::class_<OmegaSN>::
             def<std::vector<double,std::allocator<double>>(OmegaSN::*)()const>
                       ((class_<OmegaSN> *)&local_168,"GetParameters",
                        (offset_in_OmegaOP_to_subr *)local_150);
    cf.super_function.super_object.super_handle.m_ptr = (function)OmegaSN::GetGlobalCost;
    pcVar7 = pybind11::class_<OmegaSN>::def<double(OmegaSN::*)()const>
                       (pcVar7,"GetGlobalCost",(offset_in_OmegaOP_to_subr *)&cf);
    local_110.super_arg.name = (char *)OmegaSN::GetPruning;
    local_110.super_arg._8_8_ = 0;
    pybind11::class_<OmegaSN>::def<double(OmegaSN::*)()const>
              (pcVar7,"GetPruning",(offset_in_OmegaOP_to_subr *)&local_110);
    pybind11::object::~object((object *)&local_168);
    local_148.m_ptr = (PyObject *)m.super_object.super_handle.m_ptr;
    local_140 = "__doc__";
    local_138[0].super_handle.m_ptr = (handle)(PyObject *)0x0;
    pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_150,
               (char (*) [45])"python interface to segmentaition algorithms");
    pybind11::object::~object(local_138);
    local_168.name = (char *)op2D_float;
    local_150 = (undefined1  [8])((long)"vector<bool>::_M_insert_aux" + 0x1a);
    local_148.m_ptr._0_1_ = 2;
    cf.super_function.super_object.super_handle.m_ptr = (function)((long)"penality" + 7);
    local_110.super_arg.name = "penality";
    local_110.super_arg._8_1_ = 2;
    pybind11::module::
    def<PeltResult<float,float>(*)(std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,float),char[40],pybind11::arg,pybind11::arg,pybind11::arg>
              (&m,"op2D",
               (_func_PeltResult<float,_float>_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_float
                **)&local_168,(char (*) [40])"OP algorithm 2D (piece-wise linear fit)",
               (arg *)local_150,(arg *)&cf,&local_110.super_arg);
    local_70 = slopeOP;
    local_168.name = "data";
    local_168._8_1_ = 2;
    local_80.name = "states";
    local_80._8_1_ = 2;
    local_90.name = "penality";
    local_90._8_1_ = 2;
    local_40.name = "constraint";
    local_40._8_1_ = 2;
    pybind11::arg::operator=((arg_v *)local_150,&local_40,(char (*) [5])"null");
    local_64 = 0;
    local_50.name = "minAngle";
    local_50._8_1_ = 2;
    pybind11::arg::operator=((arg_v *)&cf,&local_50,&local_64);
    local_60.name = "type";
    local_60._8_1_ = 2;
    pybind11::arg::operator=(&local_110,&local_60,(char (*) [8])"channel");
    pybind11::module::
    def<OmegaOP*(*)(std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,double,std::__cxx11::string,double,std::__cxx11::string),char[18],pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
              (&m,"slopeOP",&local_70,(char (*) [18])"slopeOP algorithm",&local_168,&local_80,
               &local_90,(arg_v *)local_150,(arg_v *)&cf,&local_110);
    pybind11::arg_v::~arg_v(&local_110);
    pybind11::arg_v::~arg_v((arg_v *)&cf);
    pybind11::arg_v::~arg_v((arg_v *)local_150);
    local_90.name = (char *)slopeSN;
    cf.super_function.super_object.super_handle.m_ptr = (function)anon_var_dwarf_489dd;
    local_110.super_arg.name = "states";
    local_110.super_arg._8_1_ = 2;
    local_168.name = "nb_segments";
    local_168._8_1_ = 2;
    local_80.name = "constraint";
    local_80._8_1_ = 2;
    pybind11::arg::operator=((arg_v *)local_150,&local_80,(char (*) [5])"null");
    pybind11::module::
    def<OmegaSN*(*)(std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,unsigned_int,std::__cxx11::string),char[18],pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
              (&m,"slopeSN",
               (_func_OmegaSN_ptr_vector<double,_std::allocator<double>_>_vector<double,_std::allocator<double>_>_uint_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                **)&local_90,(char (*) [18])"slopeSN algorithm",(arg *)&cf,&local_110.super_arg,
               &local_168,(arg_v *)local_150);
    pybind11::arg_v::~arg_v((arg_v *)local_150);
    pybind11::object::~object(&m.super_object);
  }
  else {
    PyErr_Format(_PyExc_ImportError,
                 "Python version mismatch: module was compiled for Python %s, but the interpreter version is incompatible: %s."
                 ,"3.10",pcVar3);
    m.super_object.super_handle.m_ptr = (object)(object)(PyObject *)0x0;
  }
  return (PyObject *)m.super_object.super_handle.m_ptr;
}

Assistant:

PYBIND11_MODULE(slopeOP, m)
{
    py::class_<PeltResult<float, float>>(m, "PeltResult")
        .def(py::init([](vector<unsigned int> cp, vector<float> x, vector<float> y, double cost) {
            return new PeltResult<float, float>(cp, x, y, cost);
        }))
        .def_readwrite("cp", &PeltResult<float, float>::cp)
        .def_readwrite("x", &PeltResult<float, float>::x)
        .def_readwrite("y", &PeltResult<float, float>::y)
        .def_readwrite("cost", &PeltResult<float, float>::cost);

    py::class_<OmegaOP>(m, "OmegaOP")
        .def("GetChangepoints", [](const OmegaOP &a) {
                //
                std::vector<int> cp = a.GetChangepoints();
                for (size_t i=0; i<cp.size(); i++) {
                    cp[i] --;
                }
                return cp;
            }, pybind11::return_value_policy::copy)
        .def("GetParameters", &OmegaOP::GetParameters)
        .def("GetGlobalCost", &OmegaOP::GetGlobalCost)
        .def("GetPruning", &OmegaOP::GetPruning);

    py::class_<OmegaSN>(m, "OmegaSN")
        .def("GetChangepoints", [](const OmegaSN &a) {
                //
                std::vector<int> cp = a.GetChangepoints();
                for (size_t i=0; i<cp.size(); i++) {
                    cp[i] --;
                }
                return cp;
            }, pybind11::return_value_policy::copy)
        .def("GetParameters", &OmegaSN::GetParameters)
        .def("GetGlobalCost", &OmegaSN::GetGlobalCost)
        .def("GetPruning", &OmegaSN::GetPruning);

    m.doc() = "python interface to segmentaition algorithms"; // optional module docstring
    m.def("op2D", &op2D_float, "OP algorithm 2D (piece-wise linear fit)", py::arg("x"), py::arg("y"), py::arg("penality"));
    m.def("slopeOP", &slopeOP, "slopeOP algorithm", py::arg("data"), py::arg("states"), py::arg("penality"),
          py::arg("constraint") = "null", py::arg("minAngle") = 0, py::arg("type") = "channel");
    m.def("slopeSN", &slopeSN, "slopeSN algorithm", py::arg("data"), py::arg("states"), py::arg("nb_segments"),
          py::arg("constraint") = "null");
}